

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void fill_window(deflate_state *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  Bytef *pBVar5;
  Posf *pPVar6;
  uint uVar7;
  byte bVar8;
  uInt uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar13;
  ulong uVar14;
  size_t __n;
  ulg uVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  ulong uVar12;
  
  uVar4 = s->w_size;
  uVar10 = s->lookahead;
  while( true ) {
    uVar10 = (int)s->window_size - (uVar10 + s->strstart);
    if (s->w_size + (uVar4 - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar4,(ulong)(uVar4 - uVar10));
      uVar1 = s->strstart;
      uVar2 = s->match_start;
      uVar18 = uVar1 - uVar4;
      s->strstart = uVar18;
      s->match_start = uVar2 - uVar4;
      s->block_start = s->block_start - (ulong)uVar4;
      if (uVar18 < s->insert) {
        s->insert = uVar18;
      }
      slide_hash(s);
      uVar10 = uVar10 + uVar4;
    }
    if (s->strm->avail_in == 0) break;
    uVar10 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,uVar10);
    uVar10 = uVar10 + s->lookahead;
    s->lookahead = uVar10;
    uVar9 = s->insert;
    if (2 < uVar9 + uVar10) {
      uVar11 = s->strstart - uVar9;
      uVar12 = (ulong)uVar11;
      pBVar5 = s->window;
      bVar3 = pBVar5[uVar12];
      s->ins_h = (uint)bVar3;
      bVar8 = (byte)s->hash_shift;
      uVar18 = s->hash_mask;
      uVar11 = ((uint)pBVar5[uVar11 + 1] ^ (uint)bVar3 << (bVar8 & 0x1f)) & uVar18;
      s->ins_h = uVar11;
      do {
        bVar17 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar17) break;
        uVar7 = (uint)uVar12;
        uVar11 = ((uint)pBVar5[uVar7 + 2] ^ uVar11 << (bVar8 & 0x1f)) & uVar18;
        s->ins_h = uVar11;
        pPVar6 = s->head;
        s->prev[s->w_mask & uVar7] = pPVar6[uVar11];
        pPVar6[uVar11] = (Posf)uVar12;
        uVar12 = (ulong)(uVar7 + 1);
        s->insert = uVar9;
      } while (2 < uVar10 + uVar9);
    }
    if ((0x105 < uVar10) || (s->strm->avail_in == 0)) break;
  }
  uVar12 = s->high_water;
  uVar14 = s->window_size;
  uVar16 = uVar14 - uVar12;
  if (uVar12 <= uVar14 && uVar16 != 0) {
    uVar13 = (ulong)s->lookahead + (ulong)s->strstart;
    if (uVar12 < uVar13) {
      __n = uVar14 - uVar13;
      if (0x101 < __n) {
        __n = 0x102;
      }
      memset(s->window + uVar13,0,__n);
      uVar15 = __n + uVar13;
    }
    else {
      uVar14 = (uVar13 + 0x102) - uVar12;
      if (uVar13 + 0x102 < uVar12 || uVar14 == 0) {
        return;
      }
      if (uVar14 < uVar16) {
        uVar16 = uVar14;
      }
      memset(s->window + uVar12,0,uVar16 & 0xffffffff);
      uVar15 = uVar16 + s->high_water;
    }
    s->high_water = uVar15;
  }
  return;
}

Assistant:

local void fill_window(s)
    deflate_state *s;
{
    unsigned n;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize - more);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;
            if (s->insert > s->strstart)
                s->insert = s->strstart;
            slide_hash(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0) break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= MIN_MATCH) {
            uInt str = s->strstart - s->insert;
            s->ins_h = s->window[str];
            UPDATE_HASH(s, s->ins_h, s->window[str + 1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
            while (s->insert) {
                UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
                s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
                s->head[s->ins_h] = (Pos)str;
                str++;
                s->insert--;
                if (s->lookahead + s->insert < MIN_MATCH)
                    break;
            }
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }

    Assert((ulg)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}